

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streamio.c
# Opt level: O0

uint prvTidyReadChar(StreamIn *in)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  Bool BVar4;
  uint ch;
  tchar ch_00;
  bool bVar5;
  int local_40;
  Bool isMacChar;
  Bool isVendorChar;
  uint replMode;
  uint c1;
  uint m;
  uint n;
  uint tabsize;
  Bool keeptabs;
  uint c;
  StreamIn *in_local;
  
  if (in->pushed == no) {
    SaveLastPos(in);
    if (in->tabs < 1) {
      do {
        do {
          uVar2 = ReadCharFromStream(in);
          if (uVar2 == 0xffffffff) {
            return 0xffffffff;
          }
          tabsize = uVar2;
          if (uVar2 == 10) {
            in->curcol = 1;
            in->curline = in->curline + 1;
            goto LAB_0013633f;
          }
          if (uVar2 == 9) {
            if ((int)(in->doc->config).value[0x2b].v == 0) {
              uVar3 = (uint)(in->doc->config).value[0x53].v;
              if (uVar3 == 0) {
                local_40 = 0;
              }
              else {
                local_40 = (uVar3 - (in->curcol - 1U) % uVar3) + -1;
              }
              in->tabs = local_40;
              tabsize = 0x20;
            }
            in->curcol = in->curcol + 1;
            goto LAB_0013633f;
          }
          if (uVar2 == 0xd) {
            uVar2 = ReadCharFromStream(in);
            if (uVar2 != 10) {
              prvTidyUngetChar(uVar2,in);
            }
            tabsize = 10;
            in->curcol = 1;
            in->curline = in->curline + 1;
            goto LAB_0013633f;
          }
          if ((uVar2 == 0x1b) || ((uVar2 == 0xd && ((int)(in->doc->config).value[0x67].v == 0))))
          goto LAB_0013633f;
        } while (uVar2 < 0x20);
        if ((((in->encoding == 0) || (in->encoding == 5)) || (in->encoding == 4)) ||
           ((in->encoding == 0xd || (in->encoding == 0xc)))) {
          in->curcol = in->curcol + 1;
          goto LAB_0013633f;
        }
        if (((in->encoding == 9) || (in->encoding == 0xb)) || (in->encoding == 10)) {
          BVar4 = prvTidyIsValidUTF16FromUCS4(uVar2);
          if (BVar4 == no) {
            prvTidyReportEncodingError(in->doc,0x24c,uVar2,yes);
            tabsize = 0;
          }
          else {
            BVar4 = prvTidyIsLowSurrogate(uVar2);
            if (BVar4 != no) {
              ch = ReadCharFromStream(in);
              if (ch == 0xffffffff) {
                return 0xffffffff;
              }
              tabsize = 0;
              BVar4 = prvTidyIsHighSurrogate(ch);
              if (BVar4 != no) {
                ch_00 = prvTidyCombineSurrogatePair(ch,uVar2);
                BVar4 = prvTidyIsValidCombinedChar(ch_00);
                if (BVar4 != no) {
                  tabsize = ch_00;
                }
              }
              if (tabsize == 0) {
                prvTidyReportEncodingError(in->doc,0x24c,0,yes);
              }
            }
          }
        }
        iVar1 = in->encoding;
        if (iVar1 == 2) {
          tabsize = DecodeLatin0(tabsize);
        }
        else if (iVar1 == 6) {
          tabsize = prvTidyDecodeMacRoman(tabsize);
        }
        else if (iVar1 == 8) {
          tabsize = DecodeIbm850(tabsize);
        }
        if ((0x7f < tabsize) && (tabsize < 0xa0)) {
          bVar5 = true;
          if (in->encoding != 7) {
            bVar5 = in->encoding == 6;
          }
          iVar1 = in->encoding;
          if (in->doc->lexer != (Lexer *)0x0) {
            in->doc->lexer->lines = in->curline;
            in->doc->lexer->columns = in->curcol;
          }
          if (iVar1 == 6) {
            isVendorChar = prvTidyDecodeMacRoman(tabsize);
          }
          else {
            isVendorChar = prvTidyDecodeWin1252(tabsize);
          }
          if ((isVendorChar == no) && (bVar5)) {
            prvTidyReportEncodingError(in->doc,0x28f,tabsize,(uint)(isVendorChar == no));
          }
          else if (!bVar5) {
            prvTidyReportEncodingError(in->doc,0x24a,tabsize,(uint)(isVendorChar == no));
          }
          tabsize = isVendorChar;
        }
      } while (tabsize == 0);
      in->curcol = in->curcol + 1;
LAB_0013633f:
      in_local._4_4_ = tabsize;
    }
    else {
      in->curcol = in->curcol + 1;
      in->tabs = in->tabs + -1;
      in_local._4_4_ = 0x20;
    }
  }
  else {
    in_local._4_4_ = PopChar(in);
  }
  return in_local._4_4_;
}

Assistant:

uint TY_(ReadChar)( StreamIn *in )
{
    uint c = EndOfStream;

    if ( in->pushed )
        return PopChar( in );

    SaveLastPos( in );

    if ( in->tabs > 0 )
    {
        in->curcol++;
        in->tabs--;
        return ' ';
    }
    
    for (;;)
    {
        c = ReadCharFromStream(in);

        if ( EndOfStream == c )
            return EndOfStream;

        if (c == '\n')
        {
            in->curcol = 1;
            in->curline++;
            break;
        }

        if (c == '\t')
        {
            Bool keeptabs = cfg( in->doc, TidyKeepTabs );
            if (!keeptabs) {
                uint tabsize = cfg(in->doc, TidyTabSize);
                in->tabs = tabsize > 0 ?
                    tabsize - ((in->curcol - 1) % tabsize) - 1
                    : 0;
                c = ' ';
            }
            in->curcol++;
            break;
        }

        /* #427663 - map '\r' to '\n' - Andy Quick 11 Aug 00 */
        if (c == '\r')
        {
            c = ReadCharFromStream(in);
            if (c != '\n')
            {
                TY_(UngetChar)( c, in );
                c = '\n';
            }
            else
            {
            }
            in->curcol = 1;
            in->curline++;
            break;
        }

#ifndef NO_NATIVE_ISO2022_SUPPORT
        /* strip control characters, except for Esc */
        if (c == '\033')
            break;
#endif

        /* Form Feed is allowed in HTML */
        if ( c == '\015' && !cfgBool(in->doc, TidyXmlTags) )
            break;
            
        if ( c < 32 )
            continue; /* discard control char */

        /* watch out for chars that have already been decoded such as */
        /* IS02022, UTF-8 etc, that don't require further decoding */

        if (
            in->encoding == RAW
#ifndef NO_NATIVE_ISO2022_SUPPORT
         || in->encoding == ISO2022
#endif
         || in->encoding == UTF8
         || in->encoding == SHIFTJIS /* #431953 - RJ */
         || in->encoding == BIG5     /* #431953 - RJ */
           )
        {
            in->curcol++;
            break;
        }

        /* handle surrogate pairs */
        if ( in->encoding == UTF16LE ||
             in->encoding == UTF16   ||
             in->encoding == UTF16BE )
        {
            if ( !TY_(IsValidUTF16FromUCS4)(c) )
            {
                /* invalid UTF-16 value */
                TY_(ReportEncodingError)(in->doc, INVALID_UTF16, c, yes);
                c = 0;
            }
            else if ( TY_(IsLowSurrogate)(c) )
            {
                uint n = c;
                uint m = ReadCharFromStream( in );
                if ( m == EndOfStream )
                   return EndOfStream;

                c = 0;
                if ( TY_(IsHighSurrogate)(m) )
                {
                    n = TY_(CombineSurrogatePair)( m, n );
                    if ( TY_(IsValidCombinedChar)(n) )
                        c = n;
                }
                /* not a valid pair */
                if ( 0 == c )
                    TY_(ReportEncodingError)( in->doc, INVALID_UTF16, c, yes );
            }
        }

        /* Do first: acts on range 128 - 255 */
        switch ( in->encoding )
        {
        case MACROMAN:
            c = TY_(DecodeMacRoman)( c );
            break;
        case IBM858:
            c = DecodeIbm850( c );
            break;
        case LATIN0:
            c = DecodeLatin0( c );
            break;
        }

        /* produced e.g. as a side-effect of smart quotes in Word */
        /* but can't happen if using MACROMAN encoding */
        if ( 127 < c && c < 160 )
        {
            uint c1 = 0, replMode = DISCARDED_CHAR;
            Bool isVendorChar = ( in->encoding == WIN1252 ||
                                  in->encoding == MACROMAN );
            Bool isMacChar    = ( in->encoding == MACROMAN );
            
            /* set error position just before offending character */
            if (in->doc->lexer)
            {
                in->doc->lexer->lines = in->curline;
                in->doc->lexer->columns = in->curcol;
            }
                
            if ( isMacChar )
                c1 = TY_(DecodeMacRoman)( c );
            else
                c1 = TY_(DecodeWin1252)( c );
            if ( c1 )
                replMode = REPLACED_CHAR;
                
            if ( c1 == 0 && isVendorChar )
                TY_(ReportEncodingError)(in->doc, VENDOR_SPECIFIC_CHARS, c, replMode == DISCARDED_CHAR);
            else if ( ! isVendorChar )
                TY_(ReportEncodingError)(in->doc, INVALID_SGML_CHARS, c, replMode == DISCARDED_CHAR);
                
            c = c1;
        }

        if ( c == 0 )
            continue; /* illegal char is discarded */
        
        in->curcol++;
        break;
    }

    return c;
}